

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

const_iterator * __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::begin
          (const_iterator *__return_storage_ptr__,
          Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this)

{
  InnerMap *pIVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  Node *pNVar5;
  
  pIVar1 = this->elements_;
  uVar2 = pIVar1->num_buckets_;
  uVar3 = pIVar1->index_of_first_non_null_;
  uVar4 = uVar3;
  if (uVar3 < uVar2) {
    do {
      pNVar5 = (Node *)pIVar1->table_[uVar3];
      if (pNVar5 != (Node *)0x0) {
        if (pNVar5 == (Node *)pIVar1->table_[uVar3 ^ 1]) {
          pNVar5 = *(Node **)(pNVar5[1].kv.k_.val_.int64_value_ + 0x20);
        }
        goto LAB_002990ae;
      }
      uVar3 = uVar3 + 1;
      uVar4 = uVar2;
    } while (uVar2 != uVar3);
  }
  pNVar5 = (Node *)0x0;
  uVar3 = uVar4;
LAB_002990ae:
  (__return_storage_ptr__->it_).node_ = pNVar5;
  (__return_storage_ptr__->it_).m_ = pIVar1;
  (__return_storage_ptr__->it_).bucket_index_ = uVar3;
  return __return_storage_ptr__;
}

Assistant:

const_iterator begin() const {
    return const_iterator(iterator(elements_->begin()));
  }